

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BasePort.cpp
# Opt level: O0

uint __thiscall BasePort::GetBroadcastReadSizeQuads(BasePort *this)

{
  uint uVar1;
  BoardIO *board;
  uint boardNum;
  uint bcReadSize;
  BasePort *this_local;
  
  if ((this->IsAllBoardsRev4_6_ & 1U) == 0) {
    if ((this->IsAllBoardsRev7_ & 1U) == 0) {
      board._4_4_ = 0;
      for (board._0_4_ = 0; (uint)board < this->max_board; board._0_4_ = (uint)board + 1) {
        if (this->BoardList[(uint)board] != (BoardIO *)0x0) {
          uVar1 = (*this->BoardList[(uint)board]->_vptr_BoardIO[1])();
          board._4_4_ = board._4_4_ + (uVar1 >> 2) + 1;
        }
      }
    }
    else {
      board._4_4_ = this->NumOfBoards_ * 0x1d;
    }
    board._4_4_ = board._4_4_ + 1;
  }
  else {
    board._4_4_ = 0x110;
  }
  return board._4_4_;
}

Assistant:

unsigned int BasePort::GetBroadcastReadSizeQuads(void) const
{
    unsigned int bcReadSize;                    // Broadcast read size (depends on firmware version)
    if (IsAllBoardsRev4_6_)
        bcReadSize = 17*BoardIO::MAX_BOARDS;    // Rev 1-6: 16 * 17 = 272 max (though really should have been 16*21)
    else if (IsAllBoardsRev7_)
        bcReadSize = 29*NumOfBoards_+1;         // Rev 7: NumOfBoards * (1 seq + 28 data) + 1
    else {                                      // Rev 8+
        bcReadSize = 0;
        for (unsigned int boardNum = 0; boardNum < max_board; boardNum++) {
            BoardIO *board = BoardList[boardNum];
            if (board)
                bcReadSize += board->GetReadNumBytes()/sizeof(quadlet_t) + 1;
        }
        bcReadSize += 1;                       // Add one quadlet for timing info at end
    }
    return bcReadSize;
}